

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPLoader.cpp
# Opt level: O1

void __thiscall
Assimp::HMPImporter::ReadFirstSkin
          (HMPImporter *this,uint iNumSkins,uchar *szCursor,uchar **szCursorOut)

{
  uint *puVar1;
  uint *puVar2;
  uint iWidth;
  uint iHeight;
  aiMaterial *this_00;
  aiMaterial **ppaVar3;
  runtime_error *this_01;
  uint uVar4;
  int iVar5;
  uint *local_60;
  uchar **local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_60 = (uint *)szCursor;
  if (iNumSkins == 0) {
    __assert_fail("0 != iNumSkins",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/HMP/HMPLoader.cpp"
                  ,0x1c6,
                  "void Assimp::HMPImporter::ReadFirstSkin(unsigned int, const unsigned char *, const unsigned char **)"
                 );
  }
  if (szCursor != (uchar *)0x0) {
    uVar4 = *(uint *)szCursor;
    local_60 = (uint *)(szCursor + 4);
    local_58 = szCursorOut;
    if (uVar4 == 0) {
      uVar4 = *(uint *)(szCursor + 0xc);
      local_60 = (uint *)(szCursor + 0x10);
      if (uVar4 == 0) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"Unable to read HMP7 skin chunk","");
        std::runtime_error::runtime_error(this_01,(string *)local_50);
        *(undefined ***)this_01 = &PTR__runtime_error_008e3168;
        __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    iWidth = *local_60;
    iHeight = local_60[1];
    local_60 = local_60 + 2;
    this_00 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this_00);
    MDLImporter::ParseSkinLump_3DGS_MDL7
              (&this->super_MDLImporter,(uchar *)local_60,(uchar **)&local_60,this_00,uVar4,iWidth,
               iHeight);
    if (iNumSkins != 1) {
      uVar4 = 2;
      if (2 < iNumSkins) {
        uVar4 = iNumSkins;
      }
      iVar5 = uVar4 - 1;
      do {
        uVar4 = *local_60;
        puVar1 = local_60 + 1;
        puVar2 = local_60 + 2;
        local_60 = local_60 + 3;
        MDLImporter::SkipSkinLump_3DGS_MDL7
                  (&this->super_MDLImporter,(uchar *)local_60,(uchar **)&local_60,uVar4,*puVar1,
                   *puVar2);
        MDLImporter::SizeCheck(&this->super_MDLImporter,local_60);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    ((this->super_MDLImporter).pScene)->mNumMaterials = 1;
    ppaVar3 = (aiMaterial **)operator_new__(8);
    ((this->super_MDLImporter).pScene)->mMaterials = ppaVar3;
    *((this->super_MDLImporter).pScene)->mMaterials = this_00;
    *local_58 = (uchar *)local_60;
    return;
  }
  __assert_fail("nullptr != szCursor",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/HMP/HMPLoader.cpp"
                ,0x1c7,
                "void Assimp::HMPImporter::ReadFirstSkin(unsigned int, const unsigned char *, const unsigned char **)"
               );
}

Assistant:

void HMPImporter::ReadFirstSkin(unsigned int iNumSkins, const unsigned char* szCursor,
    const unsigned char** szCursorOut)
{
    ai_assert( 0 != iNumSkins );
    ai_assert( nullptr != szCursor);

    // read the type of the skin ...
    // sometimes we need to skip 12 bytes here, I don't know why ...
    uint32_t iType = *((uint32_t*)szCursor);
    szCursor += sizeof(uint32_t);
    if (0 == iType)
    {
        szCursor += sizeof(uint32_t) * 2;
        iType = *((uint32_t*)szCursor);
        szCursor += sizeof(uint32_t);
        if (!iType)
            throw DeadlyImportError("Unable to read HMP7 skin chunk");

    }
    // read width and height
    uint32_t iWidth  = *((uint32_t*)szCursor); szCursor += sizeof(uint32_t);
    uint32_t iHeight = *((uint32_t*)szCursor); szCursor += sizeof(uint32_t);

    // allocate an output material
    aiMaterial* pcMat = new aiMaterial();

    // read the skin, this works exactly as for MDL7
    ParseSkinLump_3DGS_MDL7(szCursor,&szCursor,
        pcMat,iType,iWidth,iHeight);

    // now we need to skip any other skins ...
    for (unsigned int i = 1; i< iNumSkins;++i)
    {
        iType   = *((uint32_t*)szCursor);   szCursor += sizeof(uint32_t);
        iWidth  = *((uint32_t*)szCursor);   szCursor += sizeof(uint32_t);
        iHeight = *((uint32_t*)szCursor);   szCursor += sizeof(uint32_t);

        SkipSkinLump_3DGS_MDL7(szCursor,&szCursor,iType,iWidth,iHeight);
        SizeCheck(szCursor);
    }

    // setup the material ...
    pScene->mNumMaterials = 1;
    pScene->mMaterials = new aiMaterial*[1];
    pScene->mMaterials[0] = pcMat;

    *szCursorOut = szCursor;
}